

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::resize(SmallVectorImpl<unsigned_char> *this,size_type N)

{
  size_t sVar1;
  iterator puVar2;
  iterator puVar3;
  iterator E;
  iterator I;
  size_type N_local;
  SmallVectorImpl<unsigned_char> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  if (N < sVar1) {
    puVar2 = SmallVectorTemplateCommon<unsigned_char,_void>::begin
                       ((SmallVectorTemplateCommon<unsigned_char,_void> *)this);
    puVar3 = SmallVectorTemplateCommon<unsigned_char,_void>::end
                       ((SmallVectorTemplateCommon<unsigned_char,_void> *)this);
    SmallVectorTemplateBase<unsigned_char,_true>::destroy_range(puVar2 + N,puVar3);
    SmallVectorBase::set_size((SmallVectorBase *)this,N);
  }
  else {
    sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
    if (sVar1 < N) {
      sVar1 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar1 < N) {
        SmallVectorTemplateBase<unsigned_char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<unsigned_char,_true>,N);
      }
      E = SmallVectorTemplateCommon<unsigned_char,_void>::end
                    ((SmallVectorTemplateCommon<unsigned_char,_void> *)this);
      puVar2 = SmallVectorTemplateCommon<unsigned_char,_void>::begin
                         ((SmallVectorTemplateCommon<unsigned_char,_void> *)this);
      for (; E != puVar2 + N; E = E + 1) {
        *E = '\0';
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,N);
    }
  }
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }